

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O1

btVector3 __thiscall gjkepa2_impl::MinkowskiDiff::Support(MinkowskiDiff *this,btVector3 *d,U index)

{
  code *UNRECOVERED_JUMPTABLE;
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  undefined8 in_XMM1_Qa;
  btVector3 bVar5;
  btVector3 bVar6;
  
  if (index != 0) {
    UNRECOVERED_JUMPTABLE = (code *)this->Ls;
    if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
      UNRECOVERED_JUMPTABLE =
           *(code **)(UNRECOVERED_JUMPTABLE +
                     *(long *)((long)&(this->m_shapes[1]->super_btCollisionShape).
                                      _vptr_btCollisionShape + *(long *)&this->field_0x88) + -1);
    }
    fVar4 = d->m_floats[2] * (this->m_toshape1).m_el[2].m_floats[2] +
            d->m_floats[0] * (this->m_toshape1).m_el[2].m_floats[0] +
            d->m_floats[1] * (this->m_toshape1).m_el[2].m_floats[1];
    uVar2 = (*UNRECOVERED_JUMPTABLE)();
    fVar1 = (float)uVar2;
    fVar3 = (float)((ulong)uVar2 >> 0x20);
    bVar5.m_floats[0] =
         (this->m_toshape0).m_basis.m_el[0].m_floats[2] * fVar4 +
         (this->m_toshape0).m_basis.m_el[0].m_floats[0] * fVar1 +
         (this->m_toshape0).m_basis.m_el[0].m_floats[1] * fVar3 +
         (this->m_toshape0).m_origin.m_floats[0];
    uVar2 = *(undefined8 *)((this->m_toshape0).m_origin.m_floats + 1);
    bVar5.m_floats[1] =
         (float)uVar2 +
         (this->m_toshape0).m_basis.m_el[1].m_floats[2] * fVar4 +
         (this->m_toshape0).m_basis.m_el[1].m_floats[0] * fVar1 +
         (this->m_toshape0).m_basis.m_el[1].m_floats[1] * fVar3;
    bVar5.m_floats[2] =
         (float)((ulong)uVar2 >> 0x20) +
         (this->m_toshape0).m_basis.m_el[2].m_floats[2] * fVar4 +
         (this->m_toshape0).m_basis.m_el[2].m_floats[0] * fVar1 +
         (this->m_toshape0).m_basis.m_el[2].m_floats[1] * fVar3;
    bVar5.m_floats[3] = 0.0;
    return (btVector3)bVar5.m_floats;
  }
  UNRECOVERED_JUMPTABLE = (code *)this->Ls;
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE =
         *(code **)(UNRECOVERED_JUMPTABLE +
                   *(long *)((long)&(this->m_shapes[0]->super_btCollisionShape).
                                    _vptr_btCollisionShape + *(long *)&this->field_0x88) + -1);
  }
  bVar6.m_floats._0_8_ = (*UNRECOVERED_JUMPTABLE)();
  bVar6.m_floats[2] = (btScalar)(int)in_XMM1_Qa;
  bVar6.m_floats[3] = (btScalar)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (btVector3)bVar6.m_floats;
}

Assistant:

btVector3				Support(const btVector3& d,U index) const
		{
			if(index)
				return(Support1(d));
			else
				return(Support0(d));
		}